

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall
google::anon_unknown_10::LogFileObject::Write
          (LogFileObject *this,bool force_flush,time_t timestamp,char *message,size_t message_len)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *__rhs;
  char cVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  __type _Var5;
  uint uVar6;
  int32 iVar7;
  long *plVar8;
  ostream *poVar9;
  string *psVar10;
  reference __lhs;
  ostream *poVar11;
  int64 iVar12;
  int *piVar13;
  size_type sVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  reference pvVar16;
  dirent *pdVar17;
  reference pvVar18;
  const_reference pvVar19;
  time_t __time1;
  uint32 uVar20;
  int iVar21;
  char *pcVar22;
  size_type __n;
  size_t i;
  long lVar23;
  ulong uVar24;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var25;
  WallTime WVar26;
  double dVar27;
  undefined1 local_640 [8];
  ostringstream time_pid_stream;
  pointer local_628;
  pointer local_620;
  undefined1 auStack_560 [152];
  undefined1 local_4c8 [8];
  ostringstream file_header_stream;
  undefined8 local_4b0;
  _Safe_iterator_base *local_4a8;
  undefined1 auStack_3e8 [152];
  undefined1 local_350 [8];
  const_iterator dir;
  time_t local_2f8;
  undefined1 auStack_270 [168];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string uidname;
  tm tm_time;
  time_t local_b0;
  time_t timestamp_local;
  undefined1 local_a0 [8];
  string hostname;
  undefined1 local_60 [8];
  string stripped_filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  timestamp_local = (time_t)&this->lock_;
  local_b0 = timestamp;
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)timestamp_local);
  if ((this->base_filename_selected_ == true) && ((this->base_filename_)._M_string_length == 0))
  goto LAB_0011ab59;
  iVar21 = 1;
  if (fLI::FLAGS_max_log_size - 1U < 0xfff) {
    iVar21 = fLI::FLAGS_max_log_size;
  }
  if ((iVar21 <= (int)(this->file_length_ >> 0x14)) ||
     (bVar4 = glog_internal_namespace_::PidHasChanged(), bVar4)) {
    if ((FILE *)this->file_ != (FILE *)0x0) {
      fclose((FILE *)this->file_);
    }
    this->file_ = (FILE *)0x0;
    this->bytes_since_flush_ = 0;
    this->dropped_mem_length_ = 0;
    this->file_length_ = 0;
    this->rollover_attempt_ = 0x1f;
LAB_00119d53:
    stripped_filename.field_2._8_8_ = &this->file_;
    uVar6 = this->rollover_attempt_ + 1;
    this->rollover_attempt_ = uVar6;
    if (uVar6 != 0x20) goto LAB_0011ab59;
    this->rollover_attempt_ = 0;
    if (fLB::FLAGS_log_utc_time == '\x01') {
      gmtime_r(&local_b0,(tm *)((long)&uidname.field_2 + 8));
    }
    else {
      localtime_r(&local_b0,(tm *)((long)&uidname.field_2 + 8));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_640);
    lVar23 = *(long *)&((_Safe_iterator_base *)((long)local_640 + -0x20))->_M_version;
    std::ios::fill();
    iVar21 = tm_time.tm_mday + 0x76c;
    auStack_560[lVar23] = 0x30;
    plVar8 = (long *)std::ostream::operator<<(local_640,iVar21);
    *(undefined8 *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x10) = 2;
    plVar8 = (long *)std::ostream::operator<<(plVar8,tm_time.tm_hour + 1);
    *(undefined8 *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x10) = 2;
    poVar9 = (ostream *)std::ostream::operator<<(plVar8,tm_time.tm_min);
    poVar9 = std::operator<<(poVar9,'-');
    *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
    plVar8 = (long *)std::ostream::operator<<(poVar9,tm_time.tm_sec);
    *(undefined8 *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x10) = 2;
    plVar8 = (long *)std::ostream::operator<<(plVar8,uidname.field_2._12_4_);
    *(undefined8 *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x10) = 2;
    poVar9 = (ostream *)std::ostream::operator<<(plVar8,uidname.field_2._8_4_);
    poVar9 = std::operator<<(poVar9,'.');
    iVar7 = glog_internal_namespace_::GetMainThreadPid();
    std::ostream::operator<<(poVar9,iVar7);
    std::__cxx11::stringbuf::str();
    hostname.field_2._8_8_ = message_len;
    if (this->base_filename_selected_ == true) {
      bVar4 = CreateLogfile(this,(string *)&tm_time.tm_zone);
      if (bVar4) {
LAB_0011a1aa:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
        lVar23 = *(long *)((long)local_4c8 + -0x18);
        std::ios::fill();
        auStack_3e8[lVar23] = 0x30;
        poVar9 = std::operator<<((ostream *)local_4c8,"Log file created at: ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_mday + 0x76c);
        poVar9 = std::operator<<(poVar9,'/');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_hour + 1);
        poVar9 = std::operator<<(poVar9,'/');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_min);
        poVar9 = std::operator<<(poVar9,' ');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,tm_time.tm_sec);
        poVar9 = std::operator<<(poVar9,':');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,uidname.field_2._12_4_);
        poVar9 = std::operator<<(poVar9,':');
        *(undefined8 *)(&poVar9->field_0x10 + (long)poVar9->_vptr_basic_ostream[-3]) = 2;
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,uidname.field_2._8_4_);
        pcVar22 = "\n";
        if (fLB::FLAGS_log_utc_time != '\0') {
          pcVar22 = " UTC\n";
        }
        poVar9 = std::operator<<(poVar9,pcVar22);
        poVar9 = std::operator<<(poVar9,"Running on machine: ");
        LogDestination::hostname_abi_cxx11_();
        poVar9 = std::operator<<(poVar9,(string *)LogDestination::hostname__abi_cxx11_);
        std::operator<<(poVar9,'\n');
        if ((anonymous_namespace)::g_application_fingerprint_abi_cxx11_._8_8_ != 0) {
          poVar9 = std::operator<<((ostream *)local_4c8,"Application fingerprint: ");
          poVar9 = std::operator<<(poVar9,(string *)
                                          (anonymous_namespace)::
                                          g_application_fingerprint_abi_cxx11_);
          std::operator<<(poVar9,'\n');
        }
        poVar9 = std::operator<<((ostream *)local_4c8,"Running duration (h:mm:ss): ");
        WVar26 = glog_internal_namespace_::WallTime_Now();
        dVar27 = this->start_time_;
        std::__cxx11::stringstream::stringstream((stringstream *)local_350);
        iVar21 = (int)(WVar26 - dVar27);
        sVar14 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)local_350 + -0x20))->_M_string_length;
        std::ios::fill();
        auStack_270[sVar14] = 0x30;
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (&dir.
                              super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                              .
                              super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                              .super__Safe_iterator_base,iVar21 / 0xe10);
        poVar11 = std::operator<<(poVar11,':');
        *(undefined8 *)(&poVar11->field_0x10 + (long)poVar11->_vptr_basic_ostream[-3]) = 2;
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (poVar11,(int)((long)((ulong)(uint)((int)((long)iVar21 / 0x3c) >> 0x1f)
                                                  << 0x20 | (long)iVar21 / 0x3c & 0xffffffffU) %
                                          0x3c));
        poVar11 = std::operator<<(poVar11,':');
        *(undefined8 *)(&poVar11->field_0x10 + (long)poVar11->_vptr_basic_ostream[-3]) = 2;
        std::ostream::operator<<(poVar11,iVar21 % 0x3c);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_350);
        poVar9 = std::operator<<(poVar9,(string *)local_60);
        poVar9 = std::operator<<(poVar9,'\n');
        poVar9 = std::operator<<(poVar9,"Log line format: [IWEF]yyyymmdd hh:mm:ss.uuuuuu ");
        poVar9 = std::operator<<(poVar9,"threadid file:line] msg");
        std::operator<<(poVar9,'\n');
        std::__cxx11::string::~string((string *)local_60);
        std::__cxx11::stringbuf::str();
        message_len = hostname.field_2._8_8_;
        _Var25 = dir.
                 super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                 .
                 super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                 .
                 super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ;
        fwrite((void *)local_350,1,
               (size_t)dir.
                       super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                       .
                       super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                       .
                       super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_current,(FILE *)this->file_);
        this->file_length_ = this->file_length_ + (int)_Var25._M_current;
        this->bytes_since_flush_ = this->bytes_since_flush_ + (int)_Var25._M_current;
        std::__cxx11::string::~string((string *)local_350);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
        std::__cxx11::string::~string((string *)&tm_time.tm_zone);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_640);
        goto LAB_0011a50c;
      }
      perror("Could not create log file");
      fprintf(_stderr,"COULD NOT CREATE LOGFILE \'%s\'!\n",tm_time.tm_zone);
    }
    else {
      pcVar22 = glog_internal_namespace_::ProgramInvocationShortName();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_60,pcVar22,(allocator<char> *)local_350);
      local_a0 = (undefined1  [8])&hostname._M_string_length;
      hostname._M_dataplus._M_p = (pointer)0x0;
      hostname._M_string_length._0_1_ = 0;
      GetHostName((string *)local_a0);
      psVar10 = glog_internal_namespace_::MyUserName_abi_cxx11_();
      std::__cxx11::string::string((string *)local_128,psVar10);
      if (uidname._M_dataplus._M_p == (pointer)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   "invalid-user");
      }
      std::operator+(&local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     '.');
      std::operator+(&local_188,&local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_1a8,&local_188,'.');
      std::operator+(&local_1c8,&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128)
      ;
      std::operator+(&local_148,&local_1c8,".log.");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8,
                     &local_148,*(char **)(LogSeverityNames + (long)this->severity_ * 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8,
                     '.');
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
      std::__cxx11::string::~string((string *)local_350);
      std::__cxx11::string::~string((string *)local_4c8);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_168);
      pvVar15 = GetLoggingDirectories_abi_cxx11_();
      std::__debug::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((const_iterator *)local_350,pvVar15);
      while( true ) {
        std::__debug::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((const_iterator *)local_4c8,pvVar15);
        bVar4 = __gnu_debug::operator!=((_Self *)local_350,(_Self *)local_4c8);
        __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base
                  ((_Safe_iterator_base *)&file_header_stream);
        if (!bVar4) break;
        __lhs = __gnu_debug::
                _Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                ::operator*((_Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                             *)local_350);
        std::operator+(&local_148,__lhs,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4c8,&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                      );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&this->base_filename_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8);
        std::__cxx11::string::~string((string *)local_4c8);
        std::__cxx11::string::~string((string *)&local_148);
        bVar4 = CreateLogfile(this,(string *)&tm_time.tm_zone);
        if (bVar4) {
          __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base((_Safe_iterator_base *)&dir);
          std::__cxx11::string::~string((string *)local_128);
          std::__cxx11::string::~string((string *)local_a0);
          std::__cxx11::string::~string((string *)local_60);
          goto LAB_0011a1aa;
        }
        __gnu_debug::
        _Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
        ::operator++((_Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                      *)local_350);
      }
      __gnu_debug::_Safe_iterator_base::~_Safe_iterator_base((_Safe_iterator_base *)&dir);
      perror("Could not create logging file");
      fprintf(_stderr,"COULD NOT CREATE A LOGGINGFILE %s!",tm_time.tm_zone);
      std::__cxx11::string::~string((string *)local_128);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)local_60);
    }
    std::__cxx11::string::~string((string *)&tm_time.tm_zone);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_640);
  }
  else {
    stripped_filename.field_2._8_8_ = &this->file_;
    if (this->file_ == (FILE *)0x0) goto LAB_00119d53;
LAB_0011a50c:
    if (stop_writing == '\0') {
      piVar13 = __errno_location();
      *piVar13 = 0;
      fwrite(message,1,message_len,*(FILE **)stripped_filename.field_2._8_8_);
      if ((fLB::FLAGS_stop_logging_if_full_disk == '\x01') && (*piVar13 == 0x1c)) {
        stop_writing = '\x01';
      }
      else {
        this->file_length_ = this->file_length_ + (int)message_len;
        uVar6 = (int)message_len + this->bytes_since_flush_;
        this->bytes_since_flush_ = uVar6;
        if ((999999 < uVar6 || force_flush) ||
           (iVar12 = glog_internal_namespace_::CycleClock_Now(), this->next_flush_time_ <= iVar12))
        {
          FlushUnlocked(this);
          if ((fLB::FLAGS_drop_log_memory == '\x01') && (0x2fffff < this->file_length_)) {
            uVar20 = (this->file_length_ & 0xfff00000) - 0x100000;
            uVar6 = uVar20 - this->dropped_mem_length_;
            if (0x1fffff < uVar6) {
              iVar21 = fileno((FILE *)this->file_);
              posix_fadvise(iVar21,(ulong)this->dropped_mem_length_,(ulong)uVar6,4);
              this->dropped_mem_length_ = uVar20;
            }
          }
          if (_ZN6google12_GLOBAL__N_111log_cleanerE_0 == '\x01') {
            if (_ZN6google12_GLOBAL__N_111log_cleanerE_1 < 0) {
              __assert_fail("enabled_ && overdue_days_ >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                            ,0x52a,
                            "void google::(anonymous namespace)::LogCleaner::Run(bool, const string &, const string &) const"
                           );
            }
            psVar10 = &this->base_filename_;
            if (this->base_filename_selected_ == false) {
              std::__debug::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_640);
              pvVar15 = GetLoggingDirectories_abi_cxx11_();
              std::__debug::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_640,pvVar15);
            }
            else {
              if ((this->base_filename_)._M_string_length == 0) {
                __assert_fail("!base_filename_selected || !base_filename.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                              ,0x52b,
                              "void google::(anonymous namespace)::LogCleaner::Run(bool, const string &, const string &) const"
                             );
              }
              std::__debug::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_640);
              sVar14 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                       find_last_of(psVar10,
                                    "/ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+-_.=/:,@"
                                    ,0,1);
              if (sVar14 == 0xffffffffffffffff) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_350,".",(allocator<char> *)local_4c8);
                std::__debug::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_640,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_350);
              }
              else {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_350,psVar10,0,sVar14 + 1);
                std::__debug::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_640,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_350);
              }
              std::__cxx11::string::~string((string *)local_350);
            }
            __rhs = &this->filename_extension_;
            __n = 0;
            while (__n < (ulong)((long)local_620 - (long)local_628 >> 5)) {
              hostname.field_2._8_8_ = __n;
              pvVar16 = std::__debug::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_640,__n);
              std::__cxx11::string::string((string *)local_a0,pvVar16);
              lVar23 = (long)_ZN6google12_GLOBAL__N_111log_cleanerE_1;
              std::__debug::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4c8);
              stripped_filename.field_2._8_8_ = opendir((char *)local_a0);
              if ((DIR *)stripped_filename.field_2._8_8_ != (DIR *)0x0) {
                while( true ) {
                  pdVar17 = readdir((DIR *)stripped_filename.field_2._8_8_);
                  if (pdVar17 == (dirent *)0x0) break;
                  if ((pdVar17->d_name[0] != '.') ||
                     ((pdVar17->d_name[1] != '\0' &&
                      ((pdVar17->d_name[1] != '.' || (pdVar17->d_name[2] != '\0')))))) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_60,pdVar17->d_name,(allocator<char> *)local_350);
                    if (hostname._M_dataplus._M_p != (pointer)0x0) {
                      pvVar18 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_a0,(size_type)(hostname._M_dataplus._M_p + -1));
                      pcVar22 = std::find<char_const*,char>
                                          ("/ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+-_.=/:,@"
                                           ,
                                           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+-_.=/:,@"
                                           ,pvVar18);
                      if (pcVar22 !=
                          "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+-_.=/:,@")
                      {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_350,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_a0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_60);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_60,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_350);
                        std::__cxx11::string::~string((string *)local_350);
                      }
                    }
                    _Var3._M_p = stripped_filename._M_dataplus._M_p;
                    local_350 = (undefined1  [8])
                                &dir.
                                 super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                 .
                                 super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                 .super__Safe_iterator_base;
                    dir.
                    super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                    .
                    super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                    .
                    super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                    dir.
                    super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                    .
                    super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                    .super__Safe_iterator_base._M_sequence._0_1_ = 0;
                    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               stripped_filename._M_dataplus._M_p;
                    for (uVar24 = 0; uVar24 < (this->base_filename_)._M_string_length;
                        uVar24 = uVar24 + 1) {
                      pvVar19 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                operator[](psVar10,uVar24);
                      if (((dir.
                            super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                            .
                            super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                            .
                            super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_current ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) || (pcVar22 = std::find<char_const*,char>
                                                     (
                                                  "/ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+-_.=/:,@"
                                                  ,
                                                  "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+-_.=/:,@"
                                                  ,pvVar19),
                                pcVar22 ==
                                "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+-_.=/:,@"
                                )) ||
                         ((dir.
                           super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                           .
                           super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                           .
                           super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_current !=
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                          && (cVar1 = *pvVar19,
                             pvVar18 = std::__cxx11::
                                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       ::operator[]((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_350,
                                                  (size_type)
                                                  ((long)&dir.
                                                  super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                                  .
                                                  super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                                  .
                                                  super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_current[-1].field_2 + 0xf)), cVar1 != *pvVar18
                             )))) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_350,*pvVar19);
                      }
                    }
                    sVar14 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_60,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_350,0);
                    if (sVar14 == 0) {
                      sVar14 = (this->filename_extension_)._M_string_length;
                      _Var25 = dir.
                               super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                               .
                               super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                               .
                               super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ;
                      if (sVar14 != 0) {
                        if (dir.
                            super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                            .
                            super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                            .
                            super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_current < _Var3._M_p) {
                          __return_storage_ptr__ =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&uidname.field_2 + 8);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                    (__return_storage_ptr__,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_60,
                                     (size_type)
                                     dir.
                                     super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                     .
                                     super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                     .
                                     super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_current,sVar14);
                          _Var5 = std::operator==(__return_storage_ptr__,__rhs);
                          if (_Var5) {
                            bVar4 = true;
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_350,__rhs);
                          }
                          else {
                            pcVar2 = (pointer)(this->filename_extension_)._M_string_length;
                            if (pcVar2 < _Var3._M_p) {
                              local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(stripped_filename._M_dataplus._M_p + -(long)pcVar2);
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&tm_time.tm_zone,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_60,(size_type)local_38,0xffffffffffffffff);
                              bVar4 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&tm_time.tm_zone,__rhs);
                              std::__cxx11::string::~string((string *)&tm_time.tm_zone);
                              bVar4 = !bVar4;
                            }
                            else {
                              bVar4 = false;
                            }
                          }
                          std::__cxx11::string::~string
                                    ((string *)(uidname.field_2._M_local_buf + 8));
                          _Var25 = dir.
                                   super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                   .
                                   super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                   .
                                   super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ;
                          if (bVar4) goto LAB_0011a9c3;
                        }
                        goto LAB_0011a8df;
                      }
LAB_0011a9c3:
                      for (; _Var25._M_current < local_38;
                          _Var25._M_current =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((_Var25._M_current)->_M_dataplus)._M_p + 1)) {
                        pvVar19 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_60,(size_type)_Var25._M_current);
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((dir.
                                      super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                      .
                                      super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                      .
                                      super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_current)->_M_dataplus)._M_p + 7U) < _Var25._M_current) {
                          if (_Var25._M_current ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(dir.
                                super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                .
                                super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                .
                                super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_current)->_M_string_length) {
                            if (*pvVar19 != '-') goto LAB_0011a8df;
                          }
                          else {
                            if (_Var25._M_current <=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(dir.
                                          super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                          .
                                          super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                          .
                                          super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_current)->_M_string_length + 6U)) goto LAB_0011aa1d;
                            if (_Var25._M_current ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(dir.
                                          super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                          .
                                          super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                          .
                                          super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_current)->_M_string_length + 7U)) {
                              if (*pvVar19 != '.') goto LAB_0011a8df;
                            }
                            else if (&(dir.
                                       super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                       .
                                       super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                       .
                                       super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_current)->field_2 <= _Var25._M_current) goto LAB_0011aa1d;
                          }
                        }
                        else {
LAB_0011aa1d:
                          if ((byte)(*pvVar19 - 0x3aU) < 0xf6) goto LAB_0011a8df;
                        }
                      }
                      std::__cxx11::string::~string((string *)local_350);
                      iVar21 = stat((char *)local_60,(stat *)local_350);
                      if (iVar21 == 0) {
                        __time1 = time((time_t *)0x0);
                        dVar27 = difftime(__time1,local_2f8);
                        if ((double)(lVar23 * 0x15180) < dVar27) {
                          std::__debug::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_4c8,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_60);
                        }
                      }
                    }
                    else {
LAB_0011a8df:
                      std::__cxx11::string::~string((string *)local_350);
                    }
                    std::__cxx11::string::~string((string *)local_60);
                  }
                }
                closedir((DIR *)stripped_filename.field_2._8_8_);
              }
              std::__cxx11::string::~string((string *)local_a0);
              for (uVar24 = 0; uVar24 < (ulong)((long)local_4a8 - local_4b0 >> 5);
                  uVar24 = uVar24 + 1) {
                pvVar16 = std::__debug::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_4c8,uVar24);
                unlink((pvVar16->_M_dataplus)._M_p);
              }
              std::__debug::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4c8);
              __n = hostname.field_2._8_8_ + 1;
            }
            std::__debug::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_640);
          }
        }
      }
    }
    else {
      iVar12 = glog_internal_namespace_::CycleClock_Now();
      if (this->next_flush_time_ <= iVar12) {
        stop_writing = '\0';
      }
    }
  }
LAB_0011ab59:
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)timestamp_local);
  return;
}

Assistant:

void LogFileObject::Write(bool force_flush,
                          time_t timestamp,
                          const char* message,
                          size_t message_len) {
  MutexLock l(&lock_);

  // We don't log if the base_name_ is "" (which means "don't write")
  if (base_filename_selected_ && base_filename_.empty()) {
    return;
  }

  if (static_cast<int>(file_length_ >> 20) >= MaxLogSize() ||
      PidHasChanged()) {
    if (file_ != NULL) fclose(file_);
    file_ = NULL;
    file_length_ = bytes_since_flush_ = dropped_mem_length_ = 0;
    rollover_attempt_ = kRolloverAttemptFrequency-1;
  }

  // If there's no destination file, make one before outputting
  if (file_ == NULL) {
    // Try to rollover the log file every 32 log messages.  The only time
    // this could matter would be when we have trouble creating the log
    // file.  If that happens, we'll lose lots of log messages, of course!
    if (++rollover_attempt_ != kRolloverAttemptFrequency) return;
    rollover_attempt_ = 0;

    struct ::tm tm_time;
    if (FLAGS_log_utc_time)
        gmtime_r(&timestamp, &tm_time);
    else
        localtime_r(&timestamp, &tm_time);

    // The logfile's filename will have the date/time & pid in it
    ostringstream time_pid_stream;
    time_pid_stream.fill('0');
    time_pid_stream << 1900+tm_time.tm_year
                    << setw(2) << 1+tm_time.tm_mon
                    << setw(2) << tm_time.tm_mday
                    << '-'
                    << setw(2) << tm_time.tm_hour
                    << setw(2) << tm_time.tm_min
                    << setw(2) << tm_time.tm_sec
                    << '.'
                    << GetMainThreadPid();
    const string& time_pid_string = time_pid_stream.str();

    if (base_filename_selected_) {
      if (!CreateLogfile(time_pid_string)) {
        perror("Could not create log file");
        fprintf(stderr, "COULD NOT CREATE LOGFILE '%s'!\n",
                time_pid_string.c_str());
        return;
      }
    } else {
      // If no base filename for logs of this severity has been set, use a
      // default base filename of
      // "<program name>.<hostname>.<user name>.log.<severity level>.".  So
      // logfiles will have names like
      // webserver.examplehost.root.log.INFO.19990817-150000.4354, where
      // 19990817 is a date (1999 August 17), 150000 is a time (15:00:00),
      // and 4354 is the pid of the logging process.  The date & time reflect
      // when the file was created for output.
      //
      // Where does the file get put?  Successively try the directories
      // "/tmp", and "."
      string stripped_filename(
          glog_internal_namespace_::ProgramInvocationShortName());
      string hostname;
      GetHostName(&hostname);

      string uidname = MyUserName();
      // We should not call CHECK() here because this function can be
      // called after holding on to log_mutex. We don't want to
      // attempt to hold on to the same mutex, and get into a
      // deadlock. Simply use a name like invalid-user.
      if (uidname.empty()) uidname = "invalid-user";

      stripped_filename = stripped_filename+'.'+hostname+'.'
                          +uidname+".log."
                          +LogSeverityNames[severity_]+'.';
      // We're going to (potentially) try to put logs in several different dirs
      const vector<string> & log_dirs = GetLoggingDirectories();

      // Go through the list of dirs, and try to create the log file in each
      // until we succeed or run out of options
      bool success = false;
      for (vector<string>::const_iterator dir = log_dirs.begin();
           dir != log_dirs.end();
           ++dir) {
        base_filename_ = *dir + "/" + stripped_filename;
        if ( CreateLogfile(time_pid_string) ) {
          success = true;
          break;
        }
      }
      // If we never succeeded, we have to give up
      if ( success == false ) {
        perror("Could not create logging file");
        fprintf(stderr, "COULD NOT CREATE A LOGGINGFILE %s!",
                time_pid_string.c_str());
        return;
      }
    }

    // Write a header message into the log file
    ostringstream file_header_stream;
    file_header_stream.fill('0');
    file_header_stream << "Log file created at: "
                       << 1900+tm_time.tm_year << '/'
                       << setw(2) << 1+tm_time.tm_mon << '/'
                       << setw(2) << tm_time.tm_mday
                       << ' '
                       << setw(2) << tm_time.tm_hour << ':'
                       << setw(2) << tm_time.tm_min << ':'
                       << setw(2) << tm_time.tm_sec << (FLAGS_log_utc_time ? " UTC\n" : "\n")
                       << "Running on machine: "
                       << LogDestination::hostname() << '\n';

    if(!g_application_fingerprint.empty()) {
      file_header_stream << "Application fingerprint: " << g_application_fingerprint << '\n';
    }

    file_header_stream << "Running duration (h:mm:ss): "
                       << PrettyDuration(static_cast<int>(WallTime_Now() - start_time_)) << '\n'
                       << "Log line format: [IWEF]yyyymmdd hh:mm:ss.uuuuuu "
                       << "threadid file:line] msg" << '\n';
    const string& file_header_string = file_header_stream.str();

    const size_t header_len = file_header_string.size();
    fwrite(file_header_string.data(), 1, header_len, file_);
    file_length_ += header_len;
    bytes_since_flush_ += header_len;
  }

  // Write to LOG file
  if ( !stop_writing ) {
    // fwrite() doesn't return an error when the disk is full, for
    // messages that are less than 4096 bytes. When the disk is full,
    // it returns the message length for messages that are less than
    // 4096 bytes. fwrite() returns 4096 for message lengths that are
    // greater than 4096, thereby indicating an error.
    errno = 0;
    fwrite(message, 1, message_len, file_);
    if ( FLAGS_stop_logging_if_full_disk &&
         errno == ENOSPC ) {  // disk full, stop writing to disk
      stop_writing = true;  // until the disk is
      return;
    } else {
      file_length_ += message_len;
      bytes_since_flush_ += message_len;
    }
  } else {
    if ( CycleClock_Now() >= next_flush_time_ )
      stop_writing = false;  // check to see if disk has free space.
    return;  // no need to flush
  }

  // See important msgs *now*.  Also, flush logs at least every 10^6 chars,
  // or every "FLAGS_logbufsecs" seconds.
  if ( force_flush ||
       (bytes_since_flush_ >= 1000000) ||
       (CycleClock_Now() >= next_flush_time_) ) {
    FlushUnlocked();
#ifdef GLOG_OS_LINUX
    // Only consider files >= 3MiB
    if (FLAGS_drop_log_memory && file_length_ >= (3 << 20)) {
      // Don't evict the most recent 1-2MiB so as not to impact a tailer
      // of the log file and to avoid page rounding issue on linux < 4.7
      uint32 total_drop_length = (file_length_ & ~((1 << 20U) - 1U)) - (1U << 20U);
      uint32 this_drop_length = total_drop_length - dropped_mem_length_;
      if (this_drop_length >= (2 << 20)) {
        // Only advise when >= 2MiB to drop
# if defined(__ANDROID__) && defined(__ANDROID_API__) && (__ANDROID_API__ < 21)
        // 'posix_fadvise' introduced in API 21:
        // * https://android.googlesource.com/platform/bionic/+/6880f936173081297be0dc12f687d341b86a4cfa/libc/libc.map.txt#732
# else
        posix_fadvise(fileno(file_), dropped_mem_length_, this_drop_length,
                      POSIX_FADV_DONTNEED);
# endif
        dropped_mem_length_ = total_drop_length;
      }
    }
#endif

    // Remove old logs
    if (log_cleaner.enabled()) {
      log_cleaner.Run(base_filename_selected_,
                      base_filename_,
                      filename_extension_);
    }
  }
}